

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O0

void __thiscall
agge::tests::RendererTests::RendererPopulatesBitmapWithMaskDataAccordingToOffset
          (RendererTests *this)

{
  cell *pcVar1;
  cell *pcVar2;
  allocator local_1c1;
  string local_1c0 [32];
  LocationInfo local_1a0;
  uchar auStack_178 [8];
  uint8_t reference [44];
  simple_alpha<unsigned_char,_8UL> local_141;
  agge_vector<int> local_140;
  undefined1 local_138 [8];
  renderer r;
  blender<unsigned_char,_unsigned_char> blender1;
  undefined1 local_100 [8];
  bitmap<unsigned_char,_0UL,_0UL> bitmap1;
  mask_full<8UL> mask1;
  scanline_cells cells [3];
  cell cells3 [2];
  undefined1 auStack_68 [8];
  cell cells2 [3];
  undefined1 auStack_38 [8];
  cell cells1 [3];
  RendererTests *this_local;
  
  auStack_38._0_4_ = 0;
  auStack_38._4_4_ = 0;
  cells1[0].x = 0x11;
  cells1[0].area = 3;
  cells1[0].cover = 0;
  cells1[1].x = -3;
  cells1[1].area = 7;
  cells1[1].cover = 0;
  cells1[2].x = -0xe;
  auStack_68._0_4_ = 6;
  auStack_68._4_4_ = 0;
  cells2[0].x = 0xab;
  cells2[0].area = 9;
  cells2[0].cover = 0;
  cells2[1].x = -0x1e;
  cells2[1].area = 10;
  cells2[1].cover = 0;
  cells2[2].x = -0x8d;
  cells[2].second = (cell *)0x1;
  unique0x100005b9 = this;
  pcVar1 = begin<agge::tests::mocks::cell_const,3ul>((cell (*) [3])auStack_38);
  pcVar2 = end<agge::tests::mocks::cell_const,3ul>((cell (*) [3])auStack_38);
  join_0x00000010_0x00000000_ =
       std::make_pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>
                 (pcVar1,pcVar2);
  pcVar1 = begin<agge::tests::mocks::cell_const,3ul>((cell (*) [3])auStack_68);
  pcVar2 = end<agge::tests::mocks::cell_const,3ul>((cell (*) [3])auStack_68);
  cells._8_16_ = (undefined1  [16])
                 std::make_pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>
                           (pcVar1,pcVar2);
  pcVar1 = begin<agge::tests::mocks::cell_const,2ul>((cell (*) [2])&cells[2].second);
  pcVar2 = end<agge::tests::mocks::cell_const,2ul>((cell (*) [2])&cells[2].second);
  cells._24_16_ =
       (undefined1  [16])
       std::make_pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>
                 (pcVar1,pcVar2);
  tests::mocks::mask_full<8ul>::
  mask_full<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,3>
            ((mask_full<8ul> *)&bitmap1._width,
             (pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> (*) [3])
             &mask1.super_mask<8UL>._cells.
              super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,3);
  tests::mocks::bitmap<unsigned_char,_0UL,_0UL>::bitmap
            ((bitmap<unsigned_char,_0UL,_0UL> *)local_100,0xb,4);
  tests::mocks::blender<unsigned_char,_unsigned_char>::blender
            ((blender<unsigned_char,_unsigned_char> *)&r._scanline_cache._size);
  renderer::renderer((renderer *)local_138);
  local_140 = mkvector<int>(-1,3);
  renderer::operator()
            ((renderer *)local_138,(bitmap<unsigned_char,_0UL,_0UL> *)local_100,local_140,
             (rect_i *)0x0,(mask_full<8UL> *)&bitmap1._width,
             (blender<unsigned_char,_unsigned_char> *)&r._scanline_cache._size,&local_141);
  reference[0x18] = '\0';
  reference[0x19] = '\0';
  reference[0x1a] = '\0';
  reference[0x1b] = '\0';
  reference[0x1c] = '\0';
  reference[0x1d] = '\0';
  reference[0x1e] = '\0';
  reference[0x1f] = '\0';
  reference[0x20] = '\0';
  reference[0x21] = '\0';
  reference[0x22] = '\0';
  reference[0x23] = '\0';
  reference[8] = '\0';
  reference[9] = '\0';
  reference[10] = 0xab;
  reference[0xb] = 0xab;
  reference[0xc] = 0xab;
  reference[0xd] = 0x8d;
  reference[0xe] = '\0';
  reference[0xf] = '\0';
  reference[0x10] = 0xa0;
  reference[0x11] = 0xa0;
  reference[0x12] = 0xa0;
  reference[0x13] = 0xa0;
  reference[0x14] = 0xa0;
  reference[0x15] = 0xa0;
  reference[0x16] = 0xa0;
  reference[0x17] = 0xa0;
  auStack_178[0] = '\0';
  auStack_178[1] = '\x11';
  auStack_178[2] = '\x11';
  auStack_178[3] = '\x11';
  auStack_178[4] = '\x0e';
  auStack_178[5] = '\x0e';
  auStack_178[6] = '\x0e';
  auStack_178[7] = '\x0e';
  reference[0] = '\0';
  reference[1] = '\0';
  reference[2] = '\0';
  reference[3] = '\0';
  reference[4] = '\0';
  reference[5] = '\0';
  reference[6] = '\0';
  reference[7] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1c0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,&local_1c1);
  ut::LocationInfo::LocationInfo(&local_1a0,(string *)local_1c0,0x48e);
  ut::are_equal<unsigned_char,44ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((uchar (*) [44])auStack_178,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_100,&local_1a0);
  ut::LocationInfo::~LocationInfo(&local_1a0);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  renderer::~renderer((renderer *)local_138);
  tests::mocks::blender<unsigned_char,_unsigned_char>::~blender
            ((blender<unsigned_char,_unsigned_char> *)&r._scanline_cache._size);
  tests::mocks::bitmap<unsigned_char,_0UL,_0UL>::~bitmap
            ((bitmap<unsigned_char,_0UL,_0UL> *)local_100);
  tests::mocks::mask_full<8UL>::~mask_full((mask_full<8UL> *)&bitmap1._width);
  return;
}

Assistant:

test( RendererPopulatesBitmapWithMaskDataAccordingToOffset )
			{
				// INIT
				const mocks::cell cells1[] = { { 0, 0, 0x11 }, { 3, 0, -0x03 }, { 7, 0, -0x0E }, };
				const mocks::cell cells2[] = { { 6, 0, 0xAB }, { 9, 0, -0x1E }, { 10, 0, -0x8D }, };
				const mocks::cell cells3[] = { { 1, 0, 0xA0 }, { 9, 0, -0xA0 }, };
				const mocks::mask<8>::scanline_cells cells[] = {
					make_pair(begin(cells1), end(cells1)),
					make_pair(begin(cells2), end(cells2)),
					make_pair(begin(cells3), end(cells3)),
				};
				const mocks::mask_full<8> mask1(cells, 3);
				mocks::bitmap<uint8_t> bitmap1(11, 4);
				mocks::blender<uint8_t, uint8_t> blender1;
				renderer r;

				// ACT
				r(bitmap1, mkvector(-1, 3), 0, mask1, blender1, mocks::simple_alpha<uint8_t, 8>());

				// ASSERT
				uint8_t reference[] = {
					0x00, 0x11, 0x11, 0x11, 0x0E, 0x0E, 0x0E, 0x0E, 0x00, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xAB, 0xAB, 0xAB, 0x8D,
					0x00, 0x00, 0xA0, 0xA0, 0xA0, 0xA0, 0xA0, 0xA0, 0xA0, 0xA0, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
				};

				assert_equal(reference, bitmap1.data);
			}